

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_256_paramSetA.c
# Opt level: O0

void fiat_id_tc26_gost_3410_2012_256_paramSetA_opp(uint64_t *out1,uint64_t *arg1)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  uint64_t *arg1_local;
  uint64_t *out1_local;
  
  uVar1 = arg1[1];
  uVar2 = arg1[2];
  uVar3 = arg1[3];
  uVar4 = arg1[4];
  *out1 = 0x1ffffffffffb2e - *arg1;
  out1[1] = 0xffffffffffffe - uVar1;
  out1[2] = 0xffffffffffffe - uVar2;
  out1[3] = 0xffffffffffffe - uVar3;
  out1[4] = 0xffffffffffffe - uVar4;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_256_paramSetA_opp(
    uint64_t out1[5], const uint64_t arg1[5]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    x1 = (UINT64_C(0x1ffffffffffb2e) - (arg1[0]));
    x2 = (UINT64_C(0xffffffffffffe) - (arg1[1]));
    x3 = (UINT64_C(0xffffffffffffe) - (arg1[2]));
    x4 = (UINT64_C(0xffffffffffffe) - (arg1[3]));
    x5 = (UINT64_C(0xffffffffffffe) - (arg1[4]));
    out1[0] = x1;
    out1[1] = x2;
    out1[2] = x3;
    out1[3] = x4;
    out1[4] = x5;
}